

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.c
# Opt level: O0

int ksplit_core(char *s,int delimiter,int *_max,int **_offsets)

{
  size_t sVar1;
  ushort **ppuVar2;
  int *piVar3;
  int local_70;
  int local_6c;
  int *tmp_1;
  int *tmp;
  int *piStack_50;
  int l;
  int *offsets;
  int local_40;
  int last_start;
  int last_char;
  int max;
  int n;
  int i;
  int **_offsets_local;
  int *_max_local;
  int delimiter_local;
  char *s_local;
  
  last_char = 0;
  last_start = *_max;
  piStack_50 = *_offsets;
  sVar1 = strlen(s);
  max = 0;
  offsets._4_4_ = 0;
  local_40 = 0;
  do {
    if ((int)sVar1 < max) {
      *_max = last_start;
      *_offsets = piStack_50;
      return last_char;
    }
    if (delimiter == 0) {
      ppuVar2 = __ctype_b_loc();
      if ((((*ppuVar2)[(int)s[max]] & 0x2000) == 0) && (s[max] != '\0')) {
        ppuVar2 = __ctype_b_loc();
        if ((((*ppuVar2)[local_40] & 0x2000) != 0) || (local_40 == 0)) {
          offsets._4_4_ = max;
        }
      }
      else {
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[local_40] & 0x8000) != 0) {
          if (_offsets != (int **)0x0) {
            s[max] = '\0';
            piVar3 = piStack_50;
            if (last_char == last_start) {
              if (last_start == 0) {
                local_6c = 2;
              }
              else {
                local_6c = last_start << 1;
              }
              last_start = local_6c;
              piVar3 = (int *)realloc(piStack_50,(long)local_6c << 2);
              if (piVar3 == (int *)0x0) {
                free(piStack_50);
                *_offsets = (int *)0x0;
                return 0;
              }
            }
            piStack_50 = piVar3;
            piStack_50[last_char] = offsets._4_4_;
          }
          last_char = last_char + 1;
        }
      }
    }
    else if ((s[max] == delimiter) || (s[max] == '\0')) {
      if ((local_40 != 0) && (local_40 != delimiter)) {
        if (_offsets != (int **)0x0) {
          s[max] = '\0';
          piVar3 = piStack_50;
          if (last_char == last_start) {
            if (last_start == 0) {
              local_70 = 2;
            }
            else {
              local_70 = last_start << 1;
            }
            last_start = local_70;
            piVar3 = (int *)realloc(piStack_50,(long)local_70 << 2);
            if (piVar3 == (int *)0x0) {
              free(piStack_50);
              *_offsets = (int *)0x0;
              return 0;
            }
          }
          piStack_50 = piVar3;
          piStack_50[last_char] = offsets._4_4_;
        }
        last_char = last_char + 1;
      }
    }
    else if ((local_40 == delimiter) || (local_40 == 0)) {
      offsets._4_4_ = max;
    }
    local_40 = (int)s[max];
    max = max + 1;
  } while( true );
}

Assistant:

int ksplit_core(char *s, int delimiter, int *_max, int **_offsets)
{
	int i, n, max, last_char, last_start, *offsets, l;
	n = 0; max = *_max; offsets = *_offsets;
	l = strlen(s);
	
#define __ksplit_aux do {						\
		if (_offsets) {						\
			s[i] = 0;					\
			if (n == max) {					\
				int *tmp;				\
				max = max? max<<1 : 2;			\
				if ((tmp = (int*)realloc(offsets, sizeof(int) * max))) {  \
					offsets = tmp;			\
				} else	{				\
					free(offsets);			\
					*_offsets = NULL;		\
					return 0;			\
				}					\
			}						\
			offsets[n++] = last_start;			\
		} else ++n;						\
	} while (0)

	for (i = 0, last_char = last_start = 0; i <= l; ++i) {
		if (delimiter == 0) {
			if (isspace(s[i]) || s[i] == 0) {
				if (isgraph(last_char)) __ksplit_aux; // the end of a field
			} else {
				if (isspace(last_char) || last_char == 0) last_start = i;
			}
		} else {
			if (s[i] == delimiter || s[i] == 0) {
				if (last_char != 0 && last_char != delimiter) __ksplit_aux; // the end of a field
			} else {
				if (last_char == delimiter || last_char == 0) last_start = i;
			}
		}
		last_char = s[i];
	}
	*_max = max; *_offsets = offsets;
	return n;
}